

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

Expr str_cmp_sub(pExecutor exec,pContext_conflict defContext,pContext_conflict callContext,
                Expr *args,int argc)

{
  _Bool _Var1;
  int iVar2;
  size_t a_ind;
  size_t a_len_00;
  size_t b_ind;
  size_t b_len_00;
  Expr EVar3;
  Expr EVar4;
  Expr EVar5;
  Expr expr;
  Expr expr_00;
  Expr expr_01;
  Expr expr_02;
  Expr ptr;
  Expr ptr_00;
  Expr ptr_01;
  Expr ptr_02;
  Expr ptr_03;
  Expr ptr_04;
  Expr expr_03;
  int cmp_res;
  size_t b_len;
  size_t b_start;
  pString b;
  size_t a_len;
  size_t a_start;
  pString a;
  int argc_local;
  Expr *args_local;
  pContext_conflict callContext_local;
  pContext_conflict defContext_local;
  pExecutor exec_local;
  Expr res;
  
  hlp_check_args_count(argc,6,6,"__str-cmp-sub");
  EVar4._4_4_ = 0;
  EVar4.type = args->type;
  EVar4.field_1.val_atom = (args->field_1).val_atom;
  EVar3 = exec_eval(exec,callContext,EVar4);
  ptr._4_4_ = 0;
  ptr.type = EVar3.type;
  ptr.field_1.val_atom = EVar3.field_1.val_atom;
  EVar3 = dereference(ptr);
  EVar5._4_4_ = 0;
  EVar5.type = args[1].type;
  EVar5.field_1.val_atom = args[1].field_1.val_atom;
  EVar4 = exec_eval(exec,callContext,EVar5);
  ptr_00._4_4_ = 0;
  ptr_00.type = EVar4.type;
  ptr_00.field_1.val_atom = EVar4.field_1.val_atom;
  EVar4 = dereference(ptr_00);
  a_ind = longint_to_long(EVar4.field_1.val_int);
  expr._4_4_ = 0;
  expr.type = args[2].type;
  expr.field_1.val_atom = args[2].field_1.val_atom;
  EVar4 = exec_eval(exec,callContext,expr);
  ptr_01._4_4_ = 0;
  ptr_01.type = EVar4.type;
  ptr_01.field_1.val_atom = EVar4.field_1.val_atom;
  EVar4 = dereference(ptr_01);
  a_len_00 = longint_to_long(EVar4.field_1.val_int);
  expr_00._4_4_ = 0;
  expr_00.type = args[3].type;
  expr_00.field_1.val_atom = args[3].field_1.val_atom;
  EVar4 = exec_eval(exec,callContext,expr_00);
  ptr_02._4_4_ = 0;
  ptr_02.type = EVar4.type;
  ptr_02.field_1.val_atom = EVar4.field_1.val_atom;
  EVar4 = dereference(ptr_02);
  expr_01._4_4_ = 0;
  expr_01.type = args[4].type;
  expr_01.field_1.val_atom = args[4].field_1.val_atom;
  EVar5 = exec_eval(exec,callContext,expr_01);
  ptr_03._4_4_ = 0;
  ptr_03.type = EVar5.type;
  ptr_03.field_1.val_atom = EVar5.field_1.val_atom;
  EVar5 = dereference(ptr_03);
  b_ind = longint_to_long(EVar5.field_1.val_int);
  expr_02._4_4_ = 0;
  expr_02.type = args[5].type;
  expr_02.field_1.val_atom = args[5].field_1.val_atom;
  EVar5 = exec_eval(exec,callContext,expr_02);
  ptr_04._4_4_ = 0;
  ptr_04.type = EVar5.type;
  ptr_04.field_1.val_atom = EVar5.field_1.val_atom;
  EVar5 = dereference(ptr_04);
  b_len_00 = longint_to_long(EVar5.field_1.val_int);
  iVar2 = string_compare_sub(EVar3.field_1.val_str,a_ind,a_len_00,EVar4.field_1.val_str,b_ind,
                             b_len_00);
  EVar3 = make_int_from_long(exec,(long)iVar2);
  expr_03._4_4_ = 0;
  expr_03.type = EVar3.type;
  expr_03.field_1.val_atom = EVar3.field_1.val_atom;
  _Var1 = is_none(expr_03);
  if (!_Var1) {
    EVar3._4_4_ = 0;
    return EVar3;
  }
  printf("__str-cmp-sub: make_int_from_long failed\n");
  exit(1);
}

Assistant:

BUILTIN_FUNC(str_cmp_sub)
{
    hlp_check_args_count(argc, 6, 6, "__str-cmp-sub");
    pString a = dereference(EVAL_ARG(0)).val_str;
    size_t a_start = (size_t) longint_to_long(dereference(EVAL_ARG(1)).val_int);
    size_t a_len = (size_t) longint_to_long(dereference(EVAL_ARG(2)).val_int);
    pString b = dereference(EVAL_ARG(3)).val_str;
    size_t b_start = (size_t) longint_to_long(dereference(EVAL_ARG(4)).val_int);
    size_t b_len = (size_t) longint_to_long(dereference(EVAL_ARG(5)).val_int);

    int cmp_res = string_compare_sub(a, a_start, a_len, b, b_start, b_len);
    Expr res = make_int_from_long(exec, cmp_res);
    if (is_none(res))
    {
        log("__str-cmp-sub: make_int_from_long failed");
        exit(1);
    }
    return res;
}